

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::nonInitConstCheck
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TType *type)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TQualifier *this_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*type->_vptr_TType[10])(type);
  if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) != 2) {
    iVar1 = (*type->_vptr_TType[10])(type);
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar1) + 8) & 0x7f) != 0x13) {
      return;
    }
  }
  iVar1 = (*type->_vptr_TType[10])(type);
  this_00 = (TQualifier *)CONCAT44(extraout_var_01,iVar1);
  this_00->semanticName = (char *)0x0;
  *(ulong *)&this_00->field_0x8 = *(ulong *)&this_00->field_0x8 & 0xf80000141fff0000;
  TQualifier::clearLayout(this_00);
  this_00->spirvStorageClass = -1;
  this_00->spirvDecorate = (TSpirvDecorate *)0x0;
  this_00->field_0xf = this_00->field_0xf & 0xe7;
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)
            (this,loc,"variables with qualifier \'const\' must be initialized",
             (identifier->_M_dataplus)._M_p,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::nonInitConstCheck(const TSourceLoc& loc, TString& identifier, TType& type)
{
    //
    // Make the qualifier make sense, given that there is not an initializer.
    //
    if (type.getQualifier().storage == EvqConst ||
        type.getQualifier().storage == EvqConstReadOnly) {
        type.getQualifier().makeTemporary();
        error(loc, "variables with qualifier 'const' must be initialized", identifier.c_str(), "");
    }
}